

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

XML_Parser
cm_expat_XML_ExternalEntityParserCreate
          (XML_Parser oldParser,XML_Char *context,XML_Char *encodingName)

{
  HASH_TABLE *oldTable;
  HASH_TABLE *newTable;
  STRING_POOL *pool;
  HASH_TABLE *table;
  HASH_TABLE *table_00;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  XML_Parser pvVar23;
  undefined8 *puVar24;
  int iVar25;
  long *parser;
  undefined8 *puVar26;
  XML_Char *pXVar27;
  NAMED *pNVar28;
  NAMED *pNVar29;
  KEY pXVar30;
  undefined1 *puVar31;
  long *plVar32;
  long lVar33;
  long *plVar34;
  long lVar35;
  char cVar36;
  XML_Char tmp [2];
  XML_Char local_168 [312];
  
  lVar33 = *(long *)((long)oldParser + 0x68);
  lVar35 = *(long *)((long)oldParser + 0x70);
  lVar4 = *(long *)((long)oldParser + 0x78);
  lVar5 = *(long *)((long)oldParser + 0x80);
  lVar6 = *(long *)((long)oldParser + 0x88);
  lVar7 = *(long *)((long)oldParser + 0x90);
  lVar8 = *(long *)((long)oldParser + 0x98);
  lVar9 = *(long *)((long)oldParser + 0xa0);
  lVar10 = *(long *)((long)oldParser + 0xb8);
  lVar11 = *(long *)((long)oldParser + 0xc0);
  lVar12 = *(long *)((long)oldParser + 200);
  lVar13 = *(long *)((long)oldParser + 0xd0);
  lVar14 = *(long *)((long)oldParser + 0xd8);
  lVar15 = *(long *)((long)oldParser + 0xe0);
  lVar16 = *(long *)((long)oldParser + 0xf0);
  lVar17 = *(long *)((long)oldParser + 0xf8);
  lVar18 = *(long *)((long)oldParser + 0x100);
  lVar19 = *(long *)((long)oldParser + 0x108);
  lVar20 = *(long *)((long)oldParser + 0x110);
  lVar21 = *(long *)((long)oldParser + 0x278);
  plVar32 = *oldParser;
  lVar22 = *(long *)((long)oldParser + 8);
  uVar1 = *(undefined4 *)((long)oldParser + 0x238);
  pvVar23 = *(XML_Parser *)((long)oldParser + 0xe8);
  uVar2 = *(undefined4 *)((long)oldParser + 0x48c);
  uVar3 = *(undefined4 *)((long)oldParser + 0x1cc);
  if (*(int *)((long)oldParser + 0x1c8) == 0) {
    pXVar27 = (XML_Char *)0x0;
  }
  else {
    local_168[0] = *(XML_Char *)((long)oldParser + 0x488);
    pXVar27 = local_168;
  }
  parser = (long *)cm_expat_XML_ParserCreate_MM
                             (encodingName,(XML_Memory_Handling_Suite *)((long)oldParser + 0x18),
                              pXVar27);
  if (parser != (long *)0x0) {
    parser[0xd] = lVar33;
    parser[0xe] = lVar35;
    parser[0xf] = lVar4;
    parser[0x10] = lVar5;
    parser[0x11] = lVar6;
    parser[0x12] = lVar7;
    parser[0x13] = lVar8;
    parser[0x14] = lVar9;
    parser[0x17] = lVar10;
    parser[0x18] = lVar11;
    parser[0x19] = lVar12;
    parser[0x1a] = lVar13;
    parser[0x1b] = lVar14;
    parser[0x1c] = lVar15;
    parser[0x1e] = lVar16;
    parser[0x1f] = lVar17;
    parser[0x20] = lVar18;
    parser[0x21] = lVar19;
    parser[0x22] = lVar20;
    parser[0x4f] = lVar21;
    *parser = (long)plVar32;
    if (plVar32 != (long *)lVar22) {
      plVar32 = parser;
    }
    parser[1] = (long)plVar32;
    if (pvVar23 != oldParser) {
      parser[0x1d] = (long)pvVar23;
    }
    oldTable = (HASH_TABLE *)((long)oldParser + 0x290);
    *(undefined4 *)(parser + 0x47) = uVar1;
    *(undefined4 *)((long)parser + 0x1cc) = uVar3;
    *(undefined4 *)((long)parser + 0x48c) = uVar2;
    newTable = (HASH_TABLE *)(parser + 0x52);
    if (context == (XML_Char *)0x0) {
      memcpy(local_168,newTable,0x138);
      memcpy(newTable,oldTable,0x138);
      memcpy(oldTable,local_168,0x138);
      parser[0x92] = (long)oldParser;
      cm_expat_XmlPrologStateInitExternalEntity((PROLOG_STATE *)(parser + 0x3e));
      *(undefined4 *)(parser + 0x6c) = 1;
      *(undefined4 *)((long)parser + 0x484) = 1;
      return parser;
    }
    plVar34 = *(long **)((long)oldParser + 0x308);
    plVar32 = plVar34 + *(long *)((long)oldParser + 0x310);
    pool = (STRING_POOL *)(parser + 0x66);
    table = (HASH_TABLE *)(parser + 0x61);
LAB_004d6681:
    do {
      if (plVar34 == plVar32) {
        puVar26 = (undefined8 *)0x0;
      }
      else {
        puVar26 = (undefined8 *)*plVar34;
        plVar34 = plVar34 + 1;
        if (puVar26 == (undefined8 *)0x0) goto LAB_004d6681;
      }
      if (puVar26 == (undefined8 *)0x0) {
        cVar36 = '\x02';
      }
      else {
        pXVar27 = poolCopyString(pool,(XML_Char *)*puVar26);
        if (pXVar27 == (XML_Char *)0x0) {
          cVar36 = '\x01';
        }
        else {
          pNVar28 = lookup(table,pXVar27,0x10);
          cVar36 = pNVar28 == (NAMED *)0x0;
        }
      }
    } while (cVar36 == '\0');
    if (cVar36 == '\x02') {
      plVar34 = *(long **)((long)oldParser + 0x2e0);
      plVar32 = plVar34 + *(long *)((long)oldParser + 0x2e8);
      table_00 = (HASH_TABLE *)(parser + 0x5c);
LAB_004d6721:
      do {
        if (plVar34 == plVar32) {
          puVar26 = (undefined8 *)0x0;
        }
        else {
          puVar26 = (undefined8 *)*plVar34;
          plVar34 = plVar34 + 1;
          if (puVar26 == (undefined8 *)0x0) goto LAB_004d6721;
        }
        if (puVar26 == (undefined8 *)0x0) {
          iVar25 = 4;
        }
        else if ((parser[0x69] == parser[0x68]) && (iVar25 = poolGrow(pool), iVar25 == 0)) {
          iVar25 = 1;
        }
        else {
          puVar31 = (undefined1 *)parser[0x69];
          parser[0x69] = (long)(puVar31 + 1);
          *puVar31 = 0;
          pXVar27 = poolCopyString(pool,(XML_Char *)*puVar26);
          iVar25 = 1;
          if ((pXVar27 != (XML_Char *)0x0) &&
             (pNVar28 = lookup(table_00,pXVar27 + 1,0x18), pNVar28 != (NAMED *)0x0)) {
            *(undefined1 *)&pNVar28[2].name = *(undefined1 *)(puVar26 + 2);
            puVar24 = (undefined8 *)puVar26[1];
            iVar25 = 0;
            if (puVar24 != (undefined8 *)0x0) {
              *(undefined1 *)((long)&pNVar28[2].name + 1) = *(undefined1 *)((long)puVar26 + 0x11);
              pNVar29 = (NAMED *)(parser + 0x72);
              if (puVar24 != (undefined8 *)((long)oldParser + 0x390)) {
                pNVar29 = lookup(table,(KEY)*puVar24,0);
              }
              pNVar28[1].name = (KEY)pNVar29;
            }
          }
        }
      } while (iVar25 == 0);
      if (iVar25 == 4) {
        plVar32 = *(long **)((long)oldParser + 0x2b8);
        plVar34 = plVar32 + *(long *)((long)oldParser + 0x2c0);
LAB_004d68a1:
        do {
          if (plVar32 == plVar34) {
            puVar26 = (undefined8 *)0x0;
          }
          else {
            puVar26 = (undefined8 *)*plVar32;
            plVar32 = plVar32 + 1;
            if (puVar26 == (undefined8 *)0x0) goto LAB_004d68a1;
          }
          if (puVar26 == (undefined8 *)0x0) {
            puVar31 = &DAT_00000006;
          }
          else {
            pXVar27 = poolCopyString(pool,(XML_Char *)*puVar26);
            puVar31 = &DAT_00000001;
            if (pXVar27 != (XML_Char *)0x0) {
              pNVar28 = lookup((HASH_TABLE *)(parser + 0x57),pXVar27,0x28);
              if (pNVar28 == (NAMED *)0x0) {
LAB_004d6a07:
                puVar31 = &DAT_00000001;
              }
              else {
                if ((long)*(int *)(puVar26 + 3) != 0) {
                  pXVar30 = (KEY)(*(code *)parser[3])((long)*(int *)(puVar26 + 3) * 0x18);
                  pNVar28[4].name = pXVar30;
                  if (pXVar30 == (KEY)0x0) goto LAB_004d6a07;
                }
                if ((undefined8 *)puVar26[2] != (undefined8 *)0x0) {
                  pNVar29 = lookup(table_00,*(KEY *)puVar26[2],0);
                  pNVar28[2].name = (KEY)pNVar29;
                }
                uVar1 = *(undefined4 *)(puVar26 + 3);
                *(undefined4 *)&pNVar28[3].name = uVar1;
                *(undefined4 *)((long)&pNVar28[3].name + 4) = uVar1;
                if ((undefined8 *)puVar26[1] != (undefined8 *)0x0) {
                  pNVar29 = lookup(table,*(KEY *)puVar26[1],0);
                  pNVar28[1].name = (KEY)pNVar29;
                }
                if (0 < *(int *)&pNVar28[3].name) {
                  lVar33 = 0;
                  lVar35 = 0;
                  do {
                    pNVar29 = lookup(table_00,(KEY)**(undefined8 **)(puVar26[4] + lVar33),0);
                    pXVar30 = pNVar28[4].name;
                    *(NAMED **)(pXVar30 + lVar33) = pNVar29;
                    lVar4 = puVar26[4];
                    pXVar30[lVar33 + 8] = *(XML_Char *)(lVar4 + 8 + lVar33);
                    pXVar27 = *(XML_Char **)(lVar4 + 0x10 + lVar33);
                    if (pXVar27 == (XML_Char *)0x0) {
                      pXVar30 = pXVar30 + lVar33 + 0x10;
                      pXVar30[0] = '\0';
                      pXVar30[1] = '\0';
                      pXVar30[2] = '\0';
                      pXVar30[3] = '\0';
                      pXVar30[4] = '\0';
                      pXVar30[5] = '\0';
                      pXVar30[6] = '\0';
                      pXVar30[7] = '\0';
                    }
                    else {
                      pXVar27 = poolCopyString(pool,pXVar27);
                      *(XML_Char **)(pNVar28[4].name + lVar33 + 0x10) = pXVar27;
                      if (pXVar27 == (XML_Char *)0x0) goto LAB_004d6a07;
                    }
                    lVar35 = lVar35 + 1;
                    lVar33 = lVar33 + 0x18;
                  } while (lVar35 < *(int *)&pNVar28[3].name);
                }
                puVar31 = (undefined1 *)0x0;
              }
            }
          }
        } while ((int)puVar31 == 0);
        if ((((int)puVar31 == 6) &&
            (iVar25 = copyEntityTable(newTable,pool,oldTable,puVar31), iVar25 != 0)) &&
           (iVar25 = copyEntityTable((HASH_TABLE *)(parser + 0x6d),pool,
                                     (HASH_TABLE *)((long)oldParser + 0x368),puVar31), iVar25 != 0))
        {
          *(undefined4 *)(parser + 0x6c) = *(undefined4 *)((long)oldParser + 0x360);
          *(undefined4 *)((long)parser + 0x364) = *(undefined4 *)((long)oldParser + 0x364);
          *(undefined4 *)(parser + 0x74) = *(undefined4 *)((long)oldParser + 0x3a0);
          parser[0x75] = *(long *)((long)oldParser + 0x3a8);
          *(undefined4 *)(parser + 0x76) = *(undefined4 *)((long)oldParser + 0x3b0);
          *(undefined4 *)((long)parser + 0x3b4) = *(undefined4 *)((long)oldParser + 0x3b4);
          *(undefined4 *)((long)parser + 0x3bc) = *(undefined4 *)((long)oldParser + 0x3bc);
          parser[0x78] = *(long *)((long)oldParser + 0x3c0);
          iVar25 = setContext(parser,context);
          if (iVar25 != 0) {
            parser[0x41] = (long)externalEntityInitProcessor;
            return parser;
          }
        }
      }
    }
    cm_expat_XML_ParserFree(parser);
  }
  return (XML_Parser)0x0;
}

Assistant:

XML_Parser XML_ExternalEntityParserCreate(XML_Parser oldParser,
                                          const XML_Char *context,
                                          const XML_Char *encodingName)
{
  XML_Parser parser = oldParser;
  DTD *oldDtd = &dtd;
  XML_StartElementHandler oldStartElementHandler = startElementHandler;
  XML_EndElementHandler oldEndElementHandler = endElementHandler;
  XML_CharacterDataHandler oldCharacterDataHandler = characterDataHandler;
  XML_ProcessingInstructionHandler oldProcessingInstructionHandler = processingInstructionHandler;
  XML_CommentHandler oldCommentHandler = commentHandler;
  XML_StartCdataSectionHandler oldStartCdataSectionHandler = startCdataSectionHandler;
  XML_EndCdataSectionHandler oldEndCdataSectionHandler = endCdataSectionHandler;
  XML_DefaultHandler oldDefaultHandler = defaultHandler;
  XML_UnparsedEntityDeclHandler oldUnparsedEntityDeclHandler = unparsedEntityDeclHandler;
  XML_NotationDeclHandler oldNotationDeclHandler = notationDeclHandler;
  XML_StartNamespaceDeclHandler oldStartNamespaceDeclHandler = startNamespaceDeclHandler;
  XML_EndNamespaceDeclHandler oldEndNamespaceDeclHandler = endNamespaceDeclHandler;
  XML_NotStandaloneHandler oldNotStandaloneHandler = notStandaloneHandler;
  XML_ExternalEntityRefHandler oldExternalEntityRefHandler = externalEntityRefHandler;
  XML_UnknownEncodingHandler oldUnknownEncodingHandler = unknownEncodingHandler;
  XML_ElementDeclHandler oldElementDeclHandler = elementDeclHandler;
  XML_AttlistDeclHandler oldAttlistDeclHandler = attlistDeclHandler;
  XML_EntityDeclHandler oldEntityDeclHandler = entityDeclHandler;
  XML_XmlDeclHandler oldXmlDeclHandler = xmlDeclHandler;
  ELEMENT_TYPE * oldDeclElementType = declElementType;

  void *oldUserData = userData;
  void *oldHandlerArg = handlerArg;
  int oldDefaultExpandInternalEntities = defaultExpandInternalEntities;
  void *oldExternalEntityRefHandlerArg = externalEntityRefHandlerArg;
#ifdef XML_DTD
  enum XML_ParamEntityParsing oldParamEntityParsing = paramEntityParsing;
#endif
  int oldns_triplets = ns_triplets;

  if (ns) {
    XML_Char tmp[2];

    *tmp = namespaceSeparator;
    parser = XML_ParserCreate_MM(encodingName, &((Parser *)parser)->m_mem,
                                 tmp);
  }
  else {
    parser = XML_ParserCreate_MM(encodingName, &((Parser *)parser)->m_mem,
                                 NULL);
  }

  if (!parser)
    return 0;

  startElementHandler = oldStartElementHandler;
  endElementHandler = oldEndElementHandler;
  characterDataHandler = oldCharacterDataHandler;
  processingInstructionHandler = oldProcessingInstructionHandler;
  commentHandler = oldCommentHandler;
  startCdataSectionHandler = oldStartCdataSectionHandler;
  endCdataSectionHandler = oldEndCdataSectionHandler;
  defaultHandler = oldDefaultHandler;
  unparsedEntityDeclHandler = oldUnparsedEntityDeclHandler;
  notationDeclHandler = oldNotationDeclHandler;
  startNamespaceDeclHandler = oldStartNamespaceDeclHandler;
  endNamespaceDeclHandler = oldEndNamespaceDeclHandler;
  notStandaloneHandler = oldNotStandaloneHandler;
  externalEntityRefHandler = oldExternalEntityRefHandler;
  unknownEncodingHandler = oldUnknownEncodingHandler;
  elementDeclHandler = oldElementDeclHandler;
  attlistDeclHandler = oldAttlistDeclHandler;
  entityDeclHandler = oldEntityDeclHandler;
  xmlDeclHandler = oldXmlDeclHandler;
  declElementType = oldDeclElementType;
  userData = oldUserData;
  if (oldUserData == oldHandlerArg)
    handlerArg = userData;
  else
    handlerArg = parser;
  if (oldExternalEntityRefHandlerArg != oldParser)
    externalEntityRefHandlerArg = oldExternalEntityRefHandlerArg;
  defaultExpandInternalEntities = oldDefaultExpandInternalEntities;
  ns_triplets = oldns_triplets;
#ifdef XML_DTD
  paramEntityParsing = oldParamEntityParsing;
  if (context) {
#endif /* XML_DTD */
    if (!dtdCopy(&dtd, oldDtd, parser) || !setContext(parser, context)) {
      XML_ParserFree(parser);
      return 0;
    }
    processor = externalEntityInitProcessor;
#ifdef XML_DTD
  }
  else {
    dtdSwap(&dtd, oldDtd);
    parentParser = oldParser;
    XmlPrologStateInitExternalEntity(&prologState);
    dtd.complete = 1;
    hadExternalDoctype = 1;
  }
#endif /* XML_DTD */
  return parser;
}